

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_iallgather_(void *sendbuf,MPIABI_Fint *sendcount,MPIABI_Fint *sendtype,void *recvbuf,
                       MPIABI_Fint *recvcount,MPIABI_Fint *recvtype,MPIABI_Fint *comm,
                       MPIABI_Fint *request,MPIABI_Fint *ierror)

{
  mpi_iallgather_();
  return;
}

Assistant:

void mpiabi_iallgather_(
  const void * sendbuf,
  const MPIABI_Fint * sendcount,
  const MPIABI_Fint * sendtype,
  void * recvbuf,
  const MPIABI_Fint * recvcount,
  const MPIABI_Fint * recvtype,
  const MPIABI_Fint * comm,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_iallgather_(
    sendbuf,
    sendcount,
    sendtype,
    recvbuf,
    recvcount,
    recvtype,
    comm,
    request,
    ierror
  );
}